

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::CappedArray<char,_5UL>_>::dispose
          (ArrayBuilder<kj::CappedArray<char,_5UL>_> *this)

{
  CappedArray<char,_5UL> *firstElement;
  RemoveConst<kj::CappedArray<char,_5UL>_> *pRVar1;
  CappedArray<char,_5UL> *pCVar2;
  CappedArray<char,_5UL> *endCopy;
  CappedArray<char,_5UL> *posCopy;
  CappedArray<char,_5UL> *ptrCopy;
  ArrayBuilder<kj::CappedArray<char,_5UL>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pCVar2 = this->endPtr;
  if (firstElement != (CappedArray<char,_5UL> *)0x0) {
    this->ptr = (CappedArray<char,_5UL> *)0x0;
    this->pos = (RemoveConst<kj::CappedArray<char,_5UL>_> *)0x0;
    this->endPtr = (CappedArray<char,_5UL> *)0x0;
    ArrayDisposer::dispose<kj::CappedArray<char,5ul>>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 4,
               (long)pCVar2 - (long)firstElement >> 4);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }